

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::finished(torrent *this)

{
  uint uVar1;
  pointer pppVar2;
  peer_connection *ppVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  time_point32 tVar6;
  int iVar7;
  time_t tVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  *__range3;
  pointer pppVar9;
  peer_connection **p_1;
  undefined1 auVar10 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  seeds;
  peer_connection *p;
  undefined1 local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  peer_connection **local_78;
  peer_connection *local_70;
  error_code local_68;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  bVar5 = want_tick(this);
  update_list(this,(torrent_list_index_t)0x1,bVar5);
  update_state_list(this);
  set_state(this,finished);
  set_queue_position(this,(queue_position_t)0xffffffff);
  tVar6 = time_now32();
  (this->m_became_finished).__d.__r = (rep_conflict)tVar6.__d.__r;
  bVar5 = is_seed(this);
  if (bVar5) {
    completed(this);
  }
  send_upload_only(this);
  state_updated(this);
  if (this->m_completed_time == 0) {
    tVar8 = time((time_t *)0x0);
    this->m_completed_time = tVar8;
  }
  iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_88 = (undefined1  [8])(CONCAT44(extraout_var,iVar7) + 0x438);
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((ulong)p_Stack_80 & 0xffffffffffffff00);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(p_Stack_80._1_7_,1);
  uVar1 = *(uint *)(CONCAT44(extraout_var,iVar7) + 0x428);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
  if ((uVar1 >> 0xe & 1) != 0) {
    local_88 = (undefined1  [8])0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78 = (peer_connection **)0x0;
    pppVar9 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pppVar2 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pppVar9 != pppVar2) {
      do {
        ppVar3 = *pppVar9;
        local_70 = ppVar3;
        if ((ppVar3->field_0x886 & 4) == 0) {
          bVar5 = peer_connection::is_seed(ppVar3);
          if ((bVar5) || ((ppVar3->field_0x887 & 1) != 0)) goto LAB_00326f0a;
        }
        else {
LAB_00326f0a:
          ppVar3 = local_70;
          local_68 = errors::make_error_code(torrent_finished);
          bVar5 = peer_connection::can_disconnect(ppVar3,&local_68);
          if (bVar5) {
            peer_connection::peer_log(local_70,info,"SEED","CLOSING CONNECTION");
            if (p_Stack_80 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78) {
              ::std::
              vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
              ::_M_realloc_insert<libtorrent::aux::peer_connection*const&>
                        ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                          *)local_88,(iterator)p_Stack_80,&local_70);
            }
            else {
              *(peer_connection **)p_Stack_80 = local_70;
              p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)p_Stack_80 + 8);
            }
          }
        }
        pppVar9 = pppVar9 + 1;
      } while (pppVar9 != pppVar2);
    }
    p_Var4 = p_Stack_80;
    if (local_88 != (undefined1  [8])p_Stack_80) {
      auVar10 = local_88;
      do {
        ppVar3 = (peer_connection *)
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar10)->_vptr__Sp_counted_base;
        local_68 = errors::make_error_code(torrent_finished);
        (*(ppVar3->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar3,&local_68,1,0);
        auVar10 = (undefined1  [8])
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar10)->_M_use_count;
      } while (auVar10 != (undefined1  [8])p_Var4);
    }
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88,(long)local_78 - (long)local_88);
    }
  }
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    update_want_peers(this);
    if ((this->m_storage).m_disk_io != (disk_interface *)0x0) {
      iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[4])();
      uVar1 = (this->m_storage).m_idx.m_val;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_88,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
      p_Var4 = p_Stack_80;
      auVar10 = local_88;
      local_88 = (undefined1  [8])0x0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58 = (undefined8 *)0x0;
      uStack_50 = 0;
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58 = (undefined8 *)operator_new(0x28);
      *local_58 = on_cache_flushed;
      local_58[1] = 0;
      *(undefined1 *)(local_58 + 2) = 0;
      local_58[3] = auVar10;
      local_58[4] = p_Var4;
      pcStack_40 = ::std::
                   _Function_handler<void_(),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_bool))(bool)>_>
                   ::_M_invoke;
      local_48 = ::std::
                 _Function_handler<void_(),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_bool))(bool)>_>
                 ::_M_manager;
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x38))
                ((long *)CONCAT44(extraout_var_00,iVar7),uVar1);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
      }
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
    }
    if ((this->field_0x600 & 1) != 0) {
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c]
      )();
    }
  }
  return;
}

Assistant:

void torrent::finished()
	{
		update_want_tick();
		update_state_list();

		INVARIANT_CHECK;

		TORRENT_ASSERT(is_finished());

		set_state(torrent_status::finished);
		set_queue_position(no_pos);

		m_became_finished = aux::time_now32();

		// we have to call completed() before we start
		// disconnecting peers, since there's an assert
		// to make sure we're cleared the piece picker
		if (is_seed()) completed();

		send_upload_only();
		state_updated();

		if (m_completed_time == 0)
			m_completed_time = time(nullptr);

		// disconnect all seeds
		if (settings().get_bool(settings_pack::close_redundant_connections))
		{
			// TODO: 1 should disconnect all peers that have the pieces we have
			// not just seeds. It would be pretty expensive to check all pieces
			// for all peers though
			std::vector<peer_connection*> seeds;
			for (auto* p : m_connections)
			{
				TORRENT_INCREMENT(m_iterating_connections);
				TORRENT_ASSERT(p->associated_torrent().lock().get() == this);
				if (p->upload_only() && p->can_disconnect(errors::torrent_finished))
				{
#ifndef TORRENT_DISABLE_LOGGING
					p->peer_log(peer_log_alert::info, "SEED", "CLOSING CONNECTION");
#endif
					seeds.push_back(p);
				}
			}
			for (auto& p : seeds)
				p->disconnect(errors::torrent_finished, operation_t::bittorrent
					, peer_connection_interface::normal);
		}

		if (m_abort) return;

		update_want_peers();

		if (m_storage)
		{
			// we need to keep the object alive during this operation
			m_ses.disk_thread().async_release_files(m_storage
				, std::bind(&torrent::on_cache_flushed, shared_from_this(), false));
			m_ses.deferred_submit_jobs();
		}

		// this torrent just completed downloads, which means it will fall
		// under a different limit with the auto-manager. Make sure we
		// update auto-manage torrents in that case
		if (m_auto_managed)
			m_ses.trigger_auto_manage();
	}